

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

ParquetColumnSchema * __thiscall
duckdb::ParquetReader::ParseSchemaRecursive
          (ParquetColumnSchema *__return_storage_ptr__,ParquetReader *this,idx_t depth,
          idx_t max_define,idx_t max_repeat,idx_t *next_schema_idx,idx_t *next_file_idx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *__k;
  size_type *psVar2;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar3;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> *this_00;
  pointer pPVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  type tVar6;
  idx_t iVar7;
  pointer pcVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  undefined4 uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  element_type *peVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  pointer pPVar15;
  ParquetExtraTypeInfo PVar16;
  idx_t iVar17;
  idx_t iVar18;
  idx_t iVar19;
  element_type *peVar20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  char cVar22;
  bool bVar23;
  type tVar24;
  ParquetFileMetadataCache *pPVar25;
  const_reference pvVar26;
  idx_t max_repeat_00;
  pointer this_01;
  unsigned_long uVar27;
  iterator iVar28;
  mapped_type *pmVar29;
  undefined8 *puVar30;
  const_reference pvVar31;
  reference pvVar32;
  LogicalType *other;
  InvalidInputException *this_02;
  IOException *pIVar33;
  byte bVar34;
  type tVar35;
  ulong uVar36;
  byte bVar37;
  char cVar38;
  pointer pPVar39;
  undefined8 uVar40;
  ulong uVar41;
  pointer pPVar42;
  idx_t iVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  string __str;
  vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> local_398;
  undefined8 local_378;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  idx_t local_368;
  const_reference local_360;
  ParquetColumnSchema root_schema;
  undefined1 local_2c8 [32];
  undefined8 local_2a8;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  vector<duckdb_parquet::SchemaElement,_true> *local_290;
  LogicalType result_type_1;
  LogicalType local_270;
  LogicalType local_258;
  LogicalType local_240;
  LogicalType local_228;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  case_insensitive_map_t<idx_t> name_collision_count;
  child_list_t<LogicalType> local_138;
  LogicalType local_120;
  LogicalType local_108;
  LogicalType local_f0;
  LogicalType local_d8;
  ParquetColumnSchema local_c0;
  
  this_00 = &this->metadata;
  local_378 = (element_type *)max_define;
  pPVar25 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->(this_00);
  local_290 = &((pPVar25->metadata).
                super_unique_ptr<const_duckdb_parquet::FileMetaData,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
                ._M_t.
                super___uniq_ptr_impl<const_duckdb_parquet::FileMetaData,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
                ._M_t.
                super__Tuple_impl<0UL,_const_duckdb_parquet::FileMetaData_*,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
                .super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl)->
               schema;
  pvVar26 = vector<duckdb_parquet::SchemaElement,_true>::operator[](local_290,*next_schema_idx);
  local_368 = *next_schema_idx;
  tVar24 = REQUIRED;
  if (local_368 != 0) {
    tVar24 = pvVar26->repetition_type;
  }
  tVar35 = REQUIRED;
  if (((ushort)pvVar26->__isset & 4) != 0) {
    tVar35 = tVar24;
  }
  local_378 = (element_type *)(((long)local_378 + 1U) - (ulong)(tVar35 == REQUIRED));
  max_repeat_00 = (tVar35 == REPEATED) + max_repeat;
  if ((depth == 1) &&
     (pPVar25 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->(this_00),
     (pPVar25->geo_metadata).
     super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
     ._M_t.
     super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
     ._M_t.
     super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
     .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl !=
     (GeoParquetFileMetadata *)0x0)) {
    pPVar25 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->(this_00);
    this_01 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
              ::operator->(&pPVar25->geo_metadata);
    bVar23 = GeoParquetFileMetadata::IsGeometryColumn(this_01,&pvVar26->name);
    if (bVar23) {
      iVar43 = *next_file_idx;
      *next_file_idx = iVar43 + 1;
      ParseColumnSchema(&root_schema,this,pvVar26,(idx_t)local_378,max_repeat_00,local_368,iVar43,
                        COLUMN);
      paVar1 = &local_c0.name.field_2;
      local_c0.schema_type = root_schema.schema_type;
      paVar5 = &root_schema.name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)root_schema.name._M_dataplus._M_p == paVar5) {
        local_c0.name.field_2._8_8_ = root_schema.name.field_2._8_8_;
        local_c0.name._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_c0.name._M_dataplus._M_p = root_schema.name._M_dataplus._M_p;
      }
      local_c0.name._M_string_length = root_schema.name._M_string_length;
      root_schema.name._M_string_length = 0;
      root_schema.name.field_2._M_allocated_capacity =
           root_schema.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
      root_schema.name._M_dataplus._M_p = (pointer)paVar5;
      LogicalType::LogicalType(&local_c0.type,&root_schema.type);
      local_c0.parquet_type = root_schema.parquet_type;
      local_c0.type_info = root_schema.type_info;
      local_c0.parent_schema_index.index = root_schema.parent_schema_index.index;
      local_c0.type_length = root_schema.type_length;
      local_c0.type_scale = root_schema.type_scale;
      local_c0.schema_index = root_schema.schema_index;
      local_c0.column_index = root_schema.column_index;
      local_c0.max_define = root_schema.max_define;
      local_c0.max_repeat = root_schema.max_repeat;
      local_c0.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_start =
           root_schema.children.
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_c0.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           root_schema.children.
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_c0.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           root_schema.children.
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      root_schema.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      root_schema.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      root_schema.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GeoParquetFileMetadata::GeometryType();
      ParquetColumnSchema::ParquetColumnSchema(__return_storage_ptr__,&local_c0,&local_228,GEOMETRY)
      ;
      LogicalType::~LogicalType(&local_228);
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      ~vector(&local_c0.children.
               super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             );
      LogicalType::~LogicalType(&local_c0.type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0.name._M_dataplus._M_p);
      }
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      ~vector(&root_schema.children.
               super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             );
      LogicalType::~LogicalType(&root_schema.type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)root_schema.name._M_dataplus._M_p == &root_schema.name.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_01b837fd;
    }
  }
  iVar43 = local_368;
  if ((((ushort)pvVar26->__isset & 8) != 0) && (0 < pvVar26->num_children)) {
    local_398.
    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_398.
    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_398.
    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_360 = pvVar26;
    for (uVar41 = 0;
        uVar27 = NumericCastImpl<unsigned_long,_int,_false>::Convert(local_360->num_children),
        uVar41 < uVar27; uVar41 = uVar41 + 1) {
      *next_schema_idx = *next_schema_idx + 1;
      ParseSchemaRecursive
                (&root_schema,this,depth + 1,(idx_t)local_378,max_repeat_00,next_schema_idx,
                 next_file_idx);
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      emplace_back<duckdb::ParquetColumnSchema>(&local_398,&root_schema);
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      ~vector(&root_schema.children.
               super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             );
      LogicalType::~LogicalType(&root_schema.type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)root_schema.name._M_dataplus._M_p != &root_schema.name.field_2) {
        operator_delete(root_schema.name._M_dataplus._M_p);
      }
    }
    name_collision_count._M_h._M_buckets = &name_collision_count._M_h._M_single_bucket;
    name_collision_count._M_h._M_bucket_count = 1;
    name_collision_count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    name_collision_count._M_h._M_element_count = 0;
    name_collision_count._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    name_collision_count._M_h._M_rehash_policy._M_next_resize = 0;
    name_collision_count._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_2a8 = local_398.
                super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_398.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_398.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pPVar15 = (pointer)(local_2c8 + 0x10);
      pPVar42 = local_398.
                super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        __k = &pPVar42->name;
        while (iVar28 = ::std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                *)&name_collision_count,__k),
              iVar28.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
              ._M_cur != (__node_type *)0x0) {
          pmVar29 = ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&name_collision_count,__k);
          *pmVar29 = *pmVar29 + 1;
          pcVar8 = (pPVar42->name)._M_dataplus._M_p;
          local_2c8._0_8_ = pPVar15;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2c8,pcVar8,
                     pcVar8 + (long)(((string *)&(pPVar42->name)._M_string_length)->_M_dataplus).
                                    _M_p);
          ::std::__cxx11::string::append((char *)local_2c8);
          pmVar29 = ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&name_collision_count,__k);
          uVar41 = *pmVar29;
          cVar38 = '\x01';
          if (9 < uVar41) {
            uVar36 = uVar41;
            cVar22 = '\x04';
            do {
              cVar38 = cVar22;
              if (uVar36 < 100) {
                cVar38 = cVar38 + -2;
                goto LAB_01b82b95;
              }
              if (uVar36 < 1000) {
                cVar38 = cVar38 + -1;
                goto LAB_01b82b95;
              }
              if (uVar36 < 10000) goto LAB_01b82b95;
              bVar23 = 99999 < uVar36;
              uVar36 = uVar36 / 10000;
              cVar22 = cVar38 + '\x04';
            } while (bVar23);
            cVar38 = cVar38 + '\x01';
          }
LAB_01b82b95:
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&__str,cVar38);
          ::std::__detail::__to_chars_10_impl<unsigned_long>
                    (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar41);
          pPVar39 = (pointer)0xf;
          if ((pointer)local_2c8._0_8_ != pPVar15) {
            pPVar39 = (pointer)local_2c8._16_8_;
          }
          pPVar4 = (pointer)((long)(ParquetColumnSchemaType *)local_2c8._8_8_ +
                            __str._M_string_length);
          if (pPVar39 < pPVar4) {
            uVar40 = (pointer)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
              uVar40 = __str.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar40 < pPVar4) goto LAB_01b82c0c;
            puVar30 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,local_2c8._0_8_);
          }
          else {
LAB_01b82c0c:
            puVar30 = (undefined8 *)
                      ::std::__cxx11::string::_M_append(local_2c8,(ulong)__str._M_dataplus._M_p);
          }
          root_schema._0_8_ = &root_schema.name._M_string_length;
          psVar2 = puVar30 + 2;
          if ((size_type *)*puVar30 == psVar2) {
            root_schema.name._M_string_length = *psVar2;
            root_schema.name.field_2._M_allocated_capacity = puVar30[3];
          }
          else {
            root_schema.name._M_string_length = *psVar2;
            root_schema._0_8_ = (size_type *)*puVar30;
          }
          root_schema.name._M_dataplus._M_p = (pointer)puVar30[1];
          *puVar30 = psVar2;
          puVar30[1] = 0;
          *(undefined1 *)psVar2 = 0;
          ::std::__cxx11::string::operator=((string *)__k,(string *)&root_schema);
          if ((size_type *)root_schema._0_8_ != &root_schema.name._M_string_length) {
            operator_delete((void *)root_schema._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
          if ((pointer)local_2c8._0_8_ != pPVar15) {
            operator_delete((void *)local_2c8._0_8_);
          }
        }
        ::std::__cxx11::string::_M_assign((string *)__k);
        pmVar29 = ::std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&name_collision_count,__k);
        *pmVar29 = 0;
        pPVar42 = pPVar42 + 1;
      } while (pPVar42 != local_2a8);
    }
    pvVar26 = local_360;
    iVar43 = local_368;
    bVar37 = SUB21(local_360->__isset,0);
    tVar6 = local_360->converted_type;
    bVar34 = tVar6 == MAP_KEY_VALUE & bVar37 >> 4;
    if ((~bVar34 & local_368 != 0) != 0) {
      pvVar31 = vector<duckdb_parquet::SchemaElement,_true>::operator[](local_290,local_368 - 1);
      bVar34 = SUB21(pvVar31->__isset,0);
      bVar34 = bVar34 >> 3 & bVar34 >> 4 & pvVar31->converted_type == MAP &
               pvVar31->num_children == 1;
    }
    if (bVar34 == 0) {
      ParquetColumnSchema::ParquetColumnSchema(__return_storage_ptr__);
      pPVar15 = local_398.
                super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (((ulong)(((long)local_398.
                          super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_398.
                          super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7) < 2
          ) && ((bVar37 >> 4 & (tVar6 & ~MAP_KEY_VALUE) == MAP) != 0 || tVar35 == REPEATED)) {
        pvVar32 = vector<duckdb::ParquetColumnSchema,_true>::operator[]
                            ((vector<duckdb::ParquetColumnSchema,_true> *)&local_398,0);
        iVar43 = local_368;
        __return_storage_ptr__->schema_type = pvVar32->schema_type;
        ::std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->name,(string *)&pvVar32->name);
        (__return_storage_ptr__->type).id_ = (pvVar32->type).id_;
        (__return_storage_ptr__->type).physical_type_ = (pvVar32->type).physical_type_;
        psVar3 = &(__return_storage_ptr__->type).type_info_;
        uVar44 = *(undefined4 *)
                  &(psVar3->internal).
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar45 = *(undefined4 *)
                  ((long)&(__return_storage_ptr__->type).type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        pPVar15 = (pointer)(psVar3->internal).
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
        uVar46 = *(undefined4 *)
                  &(__return_storage_ptr__->type).type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar47 = *(undefined4 *)
                  ((long)&(__return_storage_ptr__->type).type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar13 = (pvVar32->type).type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var14 = (pvVar32->type).type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        (pvVar32->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (pvVar32->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var9 = (__return_storage_ptr__->type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar13;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var14;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_2a8 = pPVar15;
          uStack_2a0 = uVar46;
          uStack_29c = uVar47;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          uVar44 = (undefined4)local_2a8;
          uVar45 = local_2a8._4_4_;
          uVar46 = uStack_2a0;
          uVar47 = uStack_29c;
        }
        p_Var9 = (pvVar32->type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        *(undefined4 *)
         &(pvVar32->type).type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar44;
        *(undefined4 *)
         ((long)&(pvVar32->type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
             uVar45;
        *(undefined4 *)
         &(pvVar32->type).type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             uVar46;
        *(undefined4 *)
         ((long)&(pvVar32->type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi + 4) = uVar47;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
        }
        PVar16 = pvVar32->type_info;
        __return_storage_ptr__->parquet_type = pvVar32->parquet_type;
        __return_storage_ptr__->type_info = PVar16;
        iVar7 = pvVar32->max_define;
        uVar44 = *(undefined4 *)((long)&pvVar32->max_define + 4);
        iVar17 = pvVar32->max_repeat;
        uVar45 = *(undefined4 *)((long)&pvVar32->max_repeat + 4);
        iVar18 = pvVar32->schema_index;
        uVar46 = *(undefined4 *)((long)&pvVar32->schema_index + 4);
        iVar19 = pvVar32->column_index;
        uVar47 = *(undefined4 *)((long)&pvVar32->column_index + 4);
        uVar10 = *(undefined4 *)((long)&(pvVar32->parent_schema_index).index + 4);
        uVar11 = pvVar32->type_length;
        uVar12 = pvVar32->type_scale;
        *(int *)&(__return_storage_ptr__->parent_schema_index).index =
             (int)(pvVar32->parent_schema_index).index;
        *(undefined4 *)((long)&(__return_storage_ptr__->parent_schema_index).index + 4) = uVar10;
        __return_storage_ptr__->type_length = uVar11;
        __return_storage_ptr__->type_scale = uVar12;
        *(int *)&__return_storage_ptr__->schema_index = (int)iVar18;
        *(undefined4 *)((long)&__return_storage_ptr__->schema_index + 4) = uVar46;
        *(int *)&__return_storage_ptr__->column_index = (int)iVar19;
        *(undefined4 *)((long)&__return_storage_ptr__->column_index + 4) = uVar47;
        *(int *)&__return_storage_ptr__->max_define = (int)iVar7;
        *(undefined4 *)((long)&__return_storage_ptr__->max_define + 4) = uVar44;
        *(int *)&__return_storage_ptr__->max_repeat = (int)iVar17;
        *(undefined4 *)((long)&__return_storage_ptr__->max_repeat + 4) = uVar45;
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        _M_move_assign(&(__return_storage_ptr__->children).
                        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                       ,&pvVar32->children);
        ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->name);
      }
      else {
        __str._M_dataplus._M_p = (pointer)0x0;
        __str._M_string_length = 0;
        __str.field_2._M_allocated_capacity = 0;
        if (local_398.
            super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_398.
            super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pPVar42 = local_398.
                    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            ::std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::LogicalType_&,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                        *)&root_schema,&pPVar42->name,&pPVar42->type);
            ::std::
            vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
            ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                      ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                        *)&__str,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                        *)&root_schema);
            LogicalType::~LogicalType((LogicalType *)((long)&root_schema.name.field_2 + 8));
            if ((size_type *)root_schema._0_8_ != &root_schema.name._M_string_length) {
              operator_delete((void *)root_schema._0_8_);
            }
            pPVar42 = pPVar42 + 1;
          } while (pPVar42 != pPVar15);
        }
        local_138.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)__str._M_dataplus._M_p;
        local_138.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)__str._M_string_length;
        local_138.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)__str.field_2._M_allocated_capacity;
        __str._M_dataplus._M_p = (pointer)0x0;
        __str._M_string_length = 0;
        __str.field_2._M_allocated_capacity = 0;
        LogicalType::STRUCT(&result_type_1,&local_138);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&local_138);
        pcVar8 = (local_360->name)._M_dataplus._M_p;
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,pcVar8,pcVar8 + (local_360->name)._M_string_length);
        iVar43 = local_368;
        LogicalType::LogicalType(&local_f0,&result_type_1);
        ParquetColumnSchema::ParquetColumnSchema
                  (&root_schema,&local_1d0,&local_f0,(idx_t)local_378,max_repeat_00,iVar43,
                   *next_file_idx,COLUMN);
        LogicalType::~LogicalType(&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        local_2c8._16_8_ =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2c8._8_8_ =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_2c8._0_8_ =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_start;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_398.
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_start;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_398.
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_398.
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_398.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_398.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_398.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        ~vector((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *
                )local_2c8);
        __return_storage_ptr__->schema_type = root_schema.schema_type;
        ::std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->name,(string *)&root_schema.name);
        _Var21 = root_schema.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        peVar13 = root_schema.type.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (__return_storage_ptr__->type).id_ = root_schema.type.id_;
        (__return_storage_ptr__->type).physical_type_ = root_schema.type.physical_type_;
        psVar3 = &(__return_storage_ptr__->type).type_info_;
        uVar44 = *(undefined4 *)
                  &(psVar3->internal).
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar45 = *(undefined4 *)
                  ((long)&(__return_storage_ptr__->type).type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        pPVar15 = (pointer)(psVar3->internal).
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
        uVar46 = *(undefined4 *)
                  &(__return_storage_ptr__->type).type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar47 = *(undefined4 *)
                  ((long)&(__return_storage_ptr__->type).type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        root_schema.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        root_schema.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var9 = (__return_storage_ptr__->type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar13;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Var21._M_pi;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_2a8 = pPVar15;
          uStack_2a0 = uVar46;
          uStack_29c = uVar47;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          uVar44 = (undefined4)local_2a8;
          uVar45 = local_2a8._4_4_;
          uVar46 = uStack_2a0;
          uVar47 = uStack_29c;
        }
        _Var21._M_pi = root_schema.type.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        root_schema.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)CONCAT44(uVar45,uVar44);
        root_schema.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = uVar47;
        root_schema.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = uVar46;
        if (_Var21._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var21._M_pi);
        }
        __return_storage_ptr__->parquet_type = root_schema.parquet_type;
        __return_storage_ptr__->type_info = root_schema.type_info;
        (__return_storage_ptr__->parent_schema_index).index = root_schema.parent_schema_index.index;
        __return_storage_ptr__->type_length = root_schema.type_length;
        __return_storage_ptr__->type_scale = root_schema.type_scale;
        __return_storage_ptr__->schema_index = root_schema.schema_index;
        __return_storage_ptr__->column_index = root_schema.column_index;
        __return_storage_ptr__->max_define = root_schema.max_define;
        __return_storage_ptr__->max_repeat = root_schema.max_repeat;
        local_2c8._0_8_ =
             (__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_2c8._8_8_ =
             (__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_2c8._16_8_ =
             (__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        ~vector((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *
                )local_2c8);
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        ~vector(&root_schema.children.
                 super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               );
        LogicalType::~LogicalType(&root_schema.type);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)root_schema.name._M_dataplus._M_p != &root_schema.name.field_2) {
          operator_delete(root_schema.name._M_dataplus._M_p);
        }
        LogicalType::~LogicalType(&result_type_1);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&__str);
      }
      if (tVar35 == REPEATED) {
        LogicalType::LIST((LogicalType *)&__str,&__return_storage_ptr__->type);
        pcVar8 = (local_360->name)._M_dataplus._M_p;
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,pcVar8,pcVar8 + (local_360->name)._M_string_length);
        LogicalType::LogicalType(&local_108,(LogicalType *)&__str);
        ParquetColumnSchema::ParquetColumnSchema
                  (&root_schema,&local_1f0,&local_108,(idx_t)local_378,max_repeat_00,iVar43,
                   *next_file_idx,COLUMN);
        LogicalType::~LogicalType(&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        emplace_back<duckdb::ParquetColumnSchema>
                  (&root_schema.children.
                    super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                   ,__return_storage_ptr__);
        __return_storage_ptr__->schema_type = root_schema.schema_type;
        ::std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->name,(string *)&root_schema.name);
        _Var21 = root_schema.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        peVar20 = root_schema.type.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (__return_storage_ptr__->type).id_ = root_schema.type.id_;
        (__return_storage_ptr__->type).physical_type_ = root_schema.type.physical_type_;
        psVar3 = &(__return_storage_ptr__->type).type_info_;
        uVar44 = *(undefined4 *)
                  &(psVar3->internal).
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar45 = *(undefined4 *)
                  ((long)&(__return_storage_ptr__->type).type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
        peVar13 = (psVar3->internal).
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar46 = *(undefined4 *)
                  &(__return_storage_ptr__->type).type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
        uVar47 = *(undefined4 *)
                  ((long)&(__return_storage_ptr__->type).type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4);
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        root_schema.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        root_schema.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var9 = (__return_storage_ptr__->type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar20;
        (__return_storage_ptr__->type).type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Var21._M_pi;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_378 = peVar13;
          uStack_370 = uVar46;
          uStack_36c = uVar47;
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          uVar44 = (undefined4)local_378;
          uVar45 = local_378._4_4_;
          uVar46 = uStack_370;
          uVar47 = uStack_36c;
        }
        _Var21._M_pi = root_schema.type.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        root_schema.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)CONCAT44(uVar45,uVar44);
        root_schema.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = uVar47;
        root_schema.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = uVar46;
        if (_Var21._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var21._M_pi);
        }
        __return_storage_ptr__->parquet_type = root_schema.parquet_type;
        __return_storage_ptr__->type_info = root_schema.type_info;
        (__return_storage_ptr__->parent_schema_index).index = root_schema.parent_schema_index.index;
        __return_storage_ptr__->type_length = root_schema.type_length;
        __return_storage_ptr__->type_scale = root_schema.type_scale;
        __return_storage_ptr__->schema_index = root_schema.schema_index;
        __return_storage_ptr__->column_index = root_schema.column_index;
        __return_storage_ptr__->max_define = root_schema.max_define;
        __return_storage_ptr__->max_repeat = root_schema.max_repeat;
        local_2c8._0_8_ =
             (__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_2c8._8_8_ =
             (__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_2c8._16_8_ =
             (__return_storage_ptr__->children).
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             root_schema.children.
             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             .
             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        root_schema.children.
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        ~vector((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *
                )local_2c8);
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        ~vector(&root_schema.children.
                 super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               );
        LogicalType::~LogicalType(&root_schema.type);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)root_schema.name._M_dataplus._M_p != &root_schema.name.field_2) {
          operator_delete(root_schema.name._M_dataplus._M_p);
        }
        LogicalType::~LogicalType((LogicalType *)&__str);
      }
      optional_idx::optional_idx((optional_idx *)&root_schema,iVar43);
      (__return_storage_ptr__->parent_schema_index).index = root_schema._0_8_;
    }
    else {
      if ((long)local_398.
                super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_398.
                super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x120) {
        pIVar33 = (IOException *)__cxa_allocate_exception(0x10);
        root_schema._0_8_ = &root_schema.name._M_string_length;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&root_schema,"MAP_KEY_VALUE requires two children","");
        IOException::IOException(pIVar33,(string *)&root_schema);
        __cxa_throw(pIVar33,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (tVar35 != REPEATED) {
        pIVar33 = (IOException *)__cxa_allocate_exception(0x10);
        root_schema._0_8_ = &root_schema.name._M_string_length;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&root_schema,"MAP_KEY_VALUE needs to be repeated","");
        IOException::IOException(pIVar33,(string *)&root_schema);
        __cxa_throw(pIVar33,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar32 = vector<duckdb::ParquetColumnSchema,_true>::operator[]
                          ((vector<duckdb::ParquetColumnSchema,_true> *)&local_398,0);
      LogicalType::LogicalType(&local_240,&pvVar32->type);
      pvVar32 = vector<duckdb::ParquetColumnSchema,_true>::operator[]
                          ((vector<duckdb::ParquetColumnSchema,_true> *)&local_398,1);
      LogicalType::LogicalType(&local_258,&pvVar32->type);
      LogicalType::MAP((LogicalType *)&__str,&local_240,&local_258);
      LogicalType::~LogicalType(&local_258);
      LogicalType::~LogicalType(&local_240);
      pcVar8 = (pvVar26->name)._M_dataplus._M_p;
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,pcVar8,pcVar8 + (pvVar26->name)._M_string_length);
      other = ListType::GetChildType((LogicalType *)&__str);
      LogicalType::LogicalType(&local_270,other);
      ParquetColumnSchema::ParquetColumnSchema
                (&root_schema,&local_190,&local_270,
                 (idx_t)((long)&local_378[-1].extension_info.
                                super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                        + 7),max_repeat_00 - 1,iVar43,*next_file_idx,COLUMN);
      LogicalType::~LogicalType(&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      local_2c8._16_8_ =
           root_schema.children.
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_2c8._8_8_ =
           root_schema.children.
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_2c8._0_8_ =
           root_schema.children.
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_start;
      root_schema.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_398.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_start;
      root_schema.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_398.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      root_schema.children.
      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_398.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_398.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_398.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_398.
      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      ~vector((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *)
              local_2c8);
      pcVar8 = (pvVar26->name)._M_dataplus._M_p;
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,pcVar8,pcVar8 + (pvVar26->name)._M_string_length);
      LogicalType::LogicalType(&local_d8,(LogicalType *)&__str);
      ParquetColumnSchema::ParquetColumnSchema
                (__return_storage_ptr__,&local_1b0,&local_d8,(idx_t)local_378,max_repeat_00,iVar43,
                 *next_file_idx,COLUMN);
      LogicalType::~LogicalType(&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      emplace_back<duckdb::ParquetColumnSchema>
                (&(__return_storage_ptr__->children).
                  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                 ,&root_schema);
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      ~vector(&root_schema.children.
               super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             );
      LogicalType::~LogicalType(&root_schema.type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)root_schema.name._M_dataplus._M_p != &root_schema.name.field_2) {
        operator_delete(root_schema.name._M_dataplus._M_p);
      }
      LogicalType::~LogicalType((LogicalType *)&__str);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&name_collision_count);
    ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
    ~vector(&local_398);
    return __return_storage_ptr__;
  }
  if (((ushort)pvVar26->__isset & 1) == 0) {
    this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    root_schema._0_8_ = &root_schema.name._M_string_length;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&root_schema,
               "Node \'%s\' has neither num_children nor type set - this violates the Parquet spec (corrupted file)"
               ,"");
    InvalidInputException::InvalidInputException<char_const*>
              (this_02,(string *)&root_schema,(pvVar26->name)._M_dataplus._M_p);
    __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar7 = *next_file_idx;
  *next_file_idx = iVar7 + 1;
  ParseColumnSchema(&root_schema,this,pvVar26,(idx_t)local_378,max_repeat_00,local_368,iVar7,COLUMN)
  ;
  if (pvVar26->repetition_type == REPEATED) {
    LogicalType::LIST((LogicalType *)&name_collision_count,&root_schema.type);
    pcVar8 = (pvVar26->name)._M_dataplus._M_p;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,pcVar8,pcVar8 + (pvVar26->name)._M_string_length);
    LogicalType::LogicalType(&local_120,(LogicalType *)&name_collision_count);
    ParquetColumnSchema::ParquetColumnSchema
              (__return_storage_ptr__,&local_210,&local_120,(idx_t)local_378,max_repeat_00,iVar43,
               *next_file_idx,COLUMN);
    LogicalType::~LogicalType(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
    emplace_back<duckdb::ParquetColumnSchema>
              (&(__return_storage_ptr__->children).
                super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               ,&root_schema);
    LogicalType::~LogicalType((LogicalType *)&name_collision_count);
  }
  else {
    paVar5 = &root_schema.name.field_2;
    __return_storage_ptr__->schema_type = root_schema.schema_type;
    paVar1 = &(__return_storage_ptr__->name).field_2;
    (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)root_schema.name._M_dataplus._M_p == paVar5) {
      paVar1->_M_allocated_capacity = root_schema.name.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->name).field_2 + 8) =
           root_schema.name.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->name)._M_dataplus._M_p = root_schema.name._M_dataplus._M_p;
      (__return_storage_ptr__->name).field_2._M_allocated_capacity =
           root_schema.name.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->name)._M_string_length = root_schema.name._M_string_length;
    root_schema.name._M_string_length = 0;
    root_schema.name.field_2._M_allocated_capacity =
         root_schema.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
    root_schema.name._M_dataplus._M_p = (pointer)paVar5;
    LogicalType::LogicalType(&__return_storage_ptr__->type,&root_schema.type);
    __return_storage_ptr__->parquet_type = root_schema.parquet_type;
    __return_storage_ptr__->type_info = root_schema.type_info;
    (__return_storage_ptr__->parent_schema_index).index = root_schema.parent_schema_index.index;
    __return_storage_ptr__->type_length = root_schema.type_length;
    __return_storage_ptr__->type_scale = root_schema.type_scale;
    __return_storage_ptr__->schema_index = root_schema.schema_index;
    __return_storage_ptr__->column_index = root_schema.column_index;
    __return_storage_ptr__->max_define = root_schema.max_define;
    __return_storage_ptr__->max_repeat = root_schema.max_repeat;
    (__return_storage_ptr__->children).
    super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    _M_impl.super__Vector_impl_data._M_start =
         root_schema.children.
         super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
         super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->children).
    super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         root_schema.children.
         super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
         super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->children).
    super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         root_schema.children.
         super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
         super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    root_schema.children.
    super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    root_schema.children.
    super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    root_schema.children.
    super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::~vector
            (&root_schema.children.
              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            );
  LogicalType::~LogicalType(&root_schema.type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)root_schema.name._M_dataplus._M_p == &root_schema.name.field_2) {
    return __return_storage_ptr__;
  }
LAB_01b837fd:
  operator_delete(root_schema.name._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

ParquetColumnSchema ParquetReader::ParseSchemaRecursive(idx_t depth, idx_t max_define, idx_t max_repeat,
                                                        idx_t &next_schema_idx, idx_t &next_file_idx) {

	auto file_meta_data = GetFileMetadata();
	D_ASSERT(file_meta_data);
	D_ASSERT(next_schema_idx < file_meta_data->schema.size());
	auto &s_ele = file_meta_data->schema[next_schema_idx];
	auto this_idx = next_schema_idx;

	auto repetition_type = FieldRepetitionType::REQUIRED;
	if (s_ele.__isset.repetition_type && this_idx > 0) {
		repetition_type = s_ele.repetition_type;
	}
	if (repetition_type != FieldRepetitionType::REQUIRED) {
		max_define++;
	}
	if (repetition_type == FieldRepetitionType::REPEATED) {
		max_repeat++;
	}

	// Check for geoparquet spatial types
	if (depth == 1) {
		// geoparquet types have to be at the root of the schema, and have to be present in the kv metadata
		if (metadata->geo_metadata && metadata->geo_metadata->IsGeometryColumn(s_ele.name)) {
			auto root_schema = ParseColumnSchema(s_ele, max_define, max_repeat, this_idx, next_file_idx++);
			return ParquetColumnSchema(std::move(root_schema), GeoParquetFileMetadata::GeometryType(),
			                           ParquetColumnSchemaType::GEOMETRY);
		}
	}

	if (s_ele.__isset.num_children && s_ele.num_children > 0) { // inner node
		vector<ParquetColumnSchema> child_schemas;

		idx_t c_idx = 0;
		while (c_idx < NumericCast<idx_t>(s_ele.num_children)) {
			next_schema_idx++;

			auto child_schema = ParseSchemaRecursive(depth + 1, max_define, max_repeat, next_schema_idx, next_file_idx);
			child_schemas.push_back(std::move(child_schema));
			c_idx++;
		}
		// rename child type entries if there are case-insensitive duplicates by appending _1, _2 etc.
		// behavior consistent with CSV reader fwiw
		case_insensitive_map_t<idx_t> name_collision_count;
		for (auto &child_schema : child_schemas) {
			auto &col_name = child_schema.name;
			// avoid duplicate header names
			while (name_collision_count.find(col_name) != name_collision_count.end()) {
				name_collision_count[col_name] += 1;
				col_name = col_name + "_" + to_string(name_collision_count[col_name]);
			}
			child_schema.name = col_name;
			name_collision_count[col_name] = 0;
		}

		bool is_repeated = repetition_type == FieldRepetitionType::REPEATED;
		bool is_list = s_ele.__isset.converted_type && s_ele.converted_type == ConvertedType::LIST;
		bool is_map = s_ele.__isset.converted_type && s_ele.converted_type == ConvertedType::MAP;
		bool is_map_kv = s_ele.__isset.converted_type && s_ele.converted_type == ConvertedType::MAP_KEY_VALUE;
		if (!is_map_kv && this_idx > 0) {
			// check if the parent node of this is a map
			auto &p_ele = file_meta_data->schema[this_idx - 1];
			bool parent_is_map = p_ele.__isset.converted_type && p_ele.converted_type == ConvertedType::MAP;
			bool parent_has_children = p_ele.__isset.num_children && p_ele.num_children == 1;
			is_map_kv = parent_is_map && parent_has_children;
		}

		if (is_map_kv) {
			if (child_schemas.size() != 2) {
				throw IOException("MAP_KEY_VALUE requires two children");
			}
			if (!is_repeated) {
				throw IOException("MAP_KEY_VALUE needs to be repeated");
			}
			auto result_type = LogicalType::MAP(child_schemas[0].type, child_schemas[1].type);
			ParquetColumnSchema struct_schema(s_ele.name, ListType::GetChildType(result_type), max_define - 1,
			                                  max_repeat - 1, this_idx, next_file_idx);
			struct_schema.children = std::move(child_schemas);

			ParquetColumnSchema map_schema(s_ele.name, std::move(result_type), max_define, max_repeat, this_idx,
			                               next_file_idx);
			map_schema.children.push_back(std::move(struct_schema));
			return map_schema;
		}
		ParquetColumnSchema result;
		if (child_schemas.size() > 1 || (!is_list && !is_map && !is_repeated)) {
			child_list_t<LogicalType> struct_types;
			for (auto &child_schema : child_schemas) {
				struct_types.emplace_back(make_pair(child_schema.name, child_schema.type));
			}

			auto result_type = LogicalType::STRUCT(std::move(struct_types));
			ParquetColumnSchema struct_schema(s_ele.name, std::move(result_type), max_define, max_repeat, this_idx,
			                                  next_file_idx);
			struct_schema.children = std::move(child_schemas);
			result = std::move(struct_schema);
		} else {
			// if we have a struct with only a single type, pull up
			result = std::move(child_schemas[0]);
			result.name = s_ele.name;
		}
		if (is_repeated) {
			auto list_type = LogicalType::LIST(result.type);
			ParquetColumnSchema list_schema(s_ele.name, std::move(list_type), max_define, max_repeat, this_idx,
			                                next_file_idx);
			list_schema.children.push_back(std::move(result));
			result = std::move(list_schema);
		}
		result.parent_schema_index = this_idx;
		return result;
	} else { // leaf node
		if (!s_ele.__isset.type) {
			throw InvalidInputException(
			    "Node '%s' has neither num_children nor type set - this violates the Parquet spec (corrupted file)",
			    s_ele.name.c_str());
		}
		auto result = ParseColumnSchema(s_ele, max_define, max_repeat, this_idx, next_file_idx++);
		if (s_ele.repetition_type == FieldRepetitionType::REPEATED) {
			auto list_type = LogicalType::LIST(result.type);
			ParquetColumnSchema list_schema(s_ele.name, std::move(list_type), max_define, max_repeat, this_idx,
			                                next_file_idx);
			list_schema.children.push_back(std::move(result));
			return list_schema;
		}
		return result;
	}
}